

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3ExprAffinity(Expr *pExpr)

{
  u8 uVar1;
  Expr *pEStack_18;
  int op;
  Expr *pExpr_local;
  
  for (pEStack_18 = pExpr; (pEStack_18->flags & 0x42000) != 0; pEStack_18 = pEStack_18->pLeft) {
  }
  uVar1 = pEStack_18->op;
  if (uVar1 == 0xb0) {
    uVar1 = pEStack_18->op2;
  }
  if ((uVar1 == 0xa7) || (uVar1 == 0xa9)) {
    pExpr_local._7_1_ = sqlite3TableColumnAffinity((pEStack_18->y).pTab,(int)pEStack_18->iColumn);
  }
  else if (uVar1 == 0x8a) {
    pExpr_local._7_1_ = sqlite3ExprAffinity(((pEStack_18->x).pSelect)->pEList->a[0].pExpr);
  }
  else if (uVar1 == '$') {
    pExpr_local._7_1_ = sqlite3AffinityType((pEStack_18->u).zToken,(Column *)0x0);
  }
  else if (uVar1 == 0xb2) {
    pExpr_local._7_1_ =
         sqlite3ExprAffinity(((pEStack_18->pLeft->x).pSelect)->pEList->a[pEStack_18->iColumn].pExpr)
    ;
  }
  else if (uVar1 == 0xb1) {
    pExpr_local._7_1_ = sqlite3ExprAffinity(((pEStack_18->x).pList)->a[0].pExpr);
  }
  else {
    pExpr_local._7_1_ = pEStack_18->affExpr;
  }
  return pExpr_local._7_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  while( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
    assert( pExpr->op==TK_COLLATE
         || pExpr->op==TK_IF_NULL_ROW
         || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_COLUMN || op==TK_AGG_COLUMN ){
    assert( ExprUseYTab(pExpr) );
    assert( pExpr->y.pTab!=0 );
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    assert( pExpr->x.pSelect!=0 );
    assert( pExpr->x.pSelect->pEList!=0 );
    assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
    assert( pExpr->iColumn < pExpr->iTable );
    assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
  }
  return pExpr->affExpr;
}